

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool SetOptionValue(TidyDocImpl *doc,TidyOptionId optId,ctmbstr val)

{
  Bool BVar1;
  uint uVar2;
  TidyConfigChangeCallback UNRECOVERED_JUMPTABLE;
  TidyOptionValue *value;
  TidyOptionImpl *option;
  bool bVar3;
  
  if (optId < N_TIDY_OPTIONS) {
    option = option_defs + optId;
    if ((option->id != optId) || (option_defs[optId].type != TidyString)) {
      __assert_fail("option->id == optId && option->type == TidyString",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x1a9,"Bool SetOptionValue(TidyDocImpl *, TidyOptionId, ctmbstr)");
    }
    if (doc->pConfigChangeCallback == (TidyConfigChangeCallback)0x0) {
      bVar3 = true;
    }
    else {
      BVar1 = OptionChangedValuesDiffer((doc->config).value[optId].p,val);
      bVar3 = BVar1 == no;
    }
    value = (doc->config).value + optId;
    FreeOptionValue(doc,option,value);
    uVar2 = prvTidytmbstrlen(val);
    if (uVar2 == 0) {
      UNRECOVERED_JUMPTABLE = (TidyConfigChangeCallback)0x0;
    }
    else {
      UNRECOVERED_JUMPTABLE = (TidyConfigChangeCallback)prvTidytmbstrdup(doc->allocator,val);
    }
    value->v = (ulong)UNRECOVERED_JUMPTABLE;
    if ((!bVar3) &&
       (UNRECOVERED_JUMPTABLE = doc->pConfigChangeCallback,
       UNRECOVERED_JUMPTABLE != (TidyConfigChangeCallback)0x0)) {
      BVar1 = (*UNRECOVERED_JUMPTABLE)((TidyDoc)doc,(TidyOption)option);
      return BVar1;
    }
  }
  return (Bool)UNRECOVERED_JUMPTABLE;
}

Assistant:

static Bool SetOptionValue( TidyDocImpl* doc, TidyOptionId optId, ctmbstr val )
{
    const TidyOptionImpl* option = &option_defs[ optId ];
    Bool fire_callback = no;
    Bool status = ( optId < N_TIDY_OPTIONS );

    if ( status )
    {
        assert( option->id == optId && option->type == TidyString );

        /* Compare the old and new values. */
        if ( doc->pConfigChangeCallback )
        {
            TidyOptionValue* oldval = &(doc->config.value[ optId ]);
            fire_callback = OptionChangedValuesDiffer( oldval->p, val );
        }

        FreeOptionValue( doc, option, &doc->config.value[ optId ] );
        if ( TY_(tmbstrlen)(val)) /* Issue #218 - ONLY if it has LENGTH! */
            doc->config.value[ optId ].p = TY_(tmbstrdup)( doc->allocator, val );
        else
            doc->config.value[ optId ].p = 0; /* should already be zero, but to be sure... */
    }

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );

    return status;
}